

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

aiMesh * __thiscall Assimp::Ogre::SubMesh::ConvertToAssimpMesh(SubMesh *this,Mesh *parent)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  size_t __n;
  VertexData *pVVar3;
  pointer pVVar4;
  aiFace *paVar5;
  pointer ppBVar6;
  int iVar7;
  element_type *peVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  iterator __end2;
  aiMesh *paVar11;
  VertexData **ppVVar12;
  ulong *puVar13;
  aiFace *paVar14;
  aiVector3D *paVar15;
  size_t sVar16;
  Logger *pLVar17;
  void *pvVar18;
  uint *puVar19;
  aiBone **ppaVar20;
  pointer ppBVar21;
  mapped_type *boneWeights;
  aiBone *paVar22;
  _Base_ptr p_Var23;
  runtime_error *prVar24;
  VertexElement *element_3;
  pointer pVVar25;
  Type type;
  Type type_00;
  VertexElement *element;
  pointer pVVar26;
  size_t ii;
  ulong uVar27;
  ulong uVar28;
  pointer pVVar29;
  Bone *pBVar30;
  pointer pVVar31;
  long lVar32;
  Bone *this_00;
  size_t v;
  long lVar33;
  long lVar34;
  bool bVar35;
  bool bVar36;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> referencedBones;
  uint16_t iout;
  aiVector3D *local_2f0;
  MemoryStream *local_2d8;
  MemoryStream *local_2d0;
  aiVector3D *local_2c8;
  MemoryStream *local_2c0;
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  local_290;
  string local_260;
  long local_240;
  SubMesh *local_238;
  size_t local_230;
  ulong local_228;
  size_t local_220;
  ulong local_218;
  size_t local_210;
  ulong local_208;
  VertexData *local_200;
  aiVector3D **local_1f8;
  MemoryStream *local_1f0;
  aiBone ***local_1e8;
  pointer local_1e0;
  pointer local_1d8;
  element_type *local_1d0;
  long local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  size_t local_1b0;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  local_1a8 [2];
  ios_base local_138 [264];
  
  local_238 = this;
  if ((this->super_ISubMesh).operationType != OT_TRIANGLE_LIST) {
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Only mesh operation type OT_TRIANGLE_LIST is supported. Found "
               ,0x3e);
    std::ostream::operator<<(local_1a8,(local_238->super_ISubMesh).operationType);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar24,(string *)&local_290);
    *(undefined ***)prVar24 = &PTR__runtime_error_008bf448;
    __cxa_throw(prVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar11 = (aiMesh *)operator_new(0x520);
  paVar11->mNumVertices = 0;
  paVar11->mNumFaces = 0;
  local_1f8 = &paVar11->mVertices;
  memset(local_1f8,0,0xcc);
  paVar11->mBones = (aiBone **)0x0;
  paVar11->mMaterialIndex = 0;
  (paVar11->mName).length = 0;
  (paVar11->mName).data[0] = '\0';
  memset((paVar11->mName).data + 1,0x1b,0x3ff);
  paVar11->mNumAnimMeshes = 0;
  paVar11->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar11->mMethod = 0;
  (paVar11->mAABB).mMin.x = 0.0;
  (paVar11->mAABB).mMin.y = 0.0;
  (paVar11->mAABB).mMin.z = 0.0;
  (paVar11->mAABB).mMax.x = 0.0;
  (paVar11->mAABB).mMax.y = 0.0;
  (paVar11->mAABB).mMax.z = 0.0;
  memset(paVar11->mColors,0,0xa0);
  paVar11->mPrimitiveTypes = 4;
  __n = (this->super_ISubMesh).name._M_string_length;
  if (0xfffffffffffffc00 < __n - 0x400) {
    (paVar11->mName).length = (ai_uint32)__n;
    memcpy((paVar11->mName).data,(this->super_ISubMesh).name._M_dataplus._M_p,__n);
    (paVar11->mName).data[__n] = '\0';
  }
  uVar2 = (this->super_ISubMesh).materialIndex;
  if (uVar2 != 0xffffffff) {
    paVar11->mMaterialIndex = uVar2;
  }
  ppVVar12 = &this->vertexData;
  if ((this->super_ISubMesh).usesSharedVertexData != false) {
    ppVVar12 = &parent->sharedVertexData;
  }
  pVVar3 = *ppVVar12;
  pVVar25 = (pVVar3->vertexElements).
            super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (pVVar3->vertexElements).
           super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar25 == pVVar4) {
LAB_00461fbc:
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "Failed to import Ogre VertexElement::VES_POSITION. Mesh does not have vertex positions!"
               ,"");
    std::runtime_error::runtime_error(prVar24,(string *)local_1a8);
    *(undefined ***)prVar24 = &PTR__runtime_error_008bf448;
    __cxa_throw(prVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1e8 = &paVar11->mBones;
  pVVar26 = pVVar25;
  do {
    pVVar29 = pVVar25;
    if ((pVVar26->semantic == VES_POSITION) && (pVVar26->index == 0)) goto LAB_004614ae;
    pVVar26 = pVVar26 + 1;
  } while (pVVar26 != pVVar4);
  pVVar26 = (pointer)0x0;
LAB_004614ae:
  do {
    pVVar31 = pVVar25;
    if ((pVVar29->semantic == VES_NORMAL) && (pVVar29->index == 0)) goto LAB_004614c8;
    pVVar29 = pVVar29 + 1;
  } while (pVVar29 != pVVar4);
  pVVar29 = (pointer)0x0;
LAB_004614c8:
  do {
    if ((pVVar31->semantic == VES_TEXTURE_COORDINATES) && (pVVar31->index == 0)) goto LAB_004614df;
    pVVar31 = pVVar31 + 1;
  } while (pVVar31 != pVVar4);
  pVVar31 = (pointer)0x0;
LAB_004614df:
  do {
    if ((pVVar25->semantic == VES_TEXTURE_COORDINATES) && (pVVar25->index == 1)) goto LAB_004614f6;
    pVVar25 = pVVar25 + 1;
  } while (pVVar25 != pVVar4);
  pVVar25 = (pointer)0x0;
LAB_004614f6:
  if (pVVar26 == (pointer)0x0) goto LAB_00461fbc;
  if (pVVar26->type != VET_FLOAT3) {
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "Ogre Mesh position vertex element type != VertexElement::VET_FLOAT3. This is not supported."
               ,"");
    std::runtime_error::runtime_error(prVar24,(string *)local_1a8);
    *(undefined ***)prVar24 = &PTR__runtime_error_008bf448;
    __cxa_throw(prVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((pVVar29 != (pointer)0x0) && (pVVar29->type != VET_FLOAT3)) {
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "Ogre Mesh normal vertex element type != VertexElement::VET_FLOAT3. This is not supported."
               ,"");
    std::runtime_error::runtime_error(prVar24,(string *)local_1a8);
    *(undefined ***)prVar24 = &PTR__runtime_error_008bf448;
    __cxa_throw(prVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = this->indexData->faceCount;
  uVar28 = (ulong)uVar2;
  paVar11->mNumFaces = uVar2;
  puVar13 = (ulong *)operator_new__(uVar28 * 0x10 + 8);
  paVar5 = (aiFace *)(puVar13 + 1);
  *puVar13 = uVar28;
  if (uVar28 != 0) {
    paVar14 = paVar5;
    do {
      paVar14->mNumIndices = 0;
      paVar14->mIndices = (uint *)0x0;
      paVar14 = paVar14 + 1;
    } while (paVar14 != paVar5 + uVar28);
  }
  paVar11->mFaces = paVar5;
  paVar11->mNumVertices = uVar2 * 3;
  uVar27 = (ulong)(uVar2 * 3) * 0xc;
  paVar15 = (aiVector3D *)operator_new__(uVar27);
  if (uVar28 != 0) {
    memset(paVar15,0,((uVar27 - 0xc) / 0xc) * 0xc + 0xc);
  }
  *local_1f8 = paVar15;
  local_1f0 = VertexData::VertexBuffer(pVVar3,pVVar26->source);
  if (pVVar29 == (pointer)0x0) {
    local_2c0 = (MemoryStream *)0x0;
  }
  else {
    local_2c0 = VertexData::VertexBuffer(pVVar3,pVVar29->source);
  }
  if (pVVar31 == (pointer)0x0) {
    local_2d0 = (MemoryStream *)0x0;
  }
  else {
    local_2d0 = VertexData::VertexBuffer(pVVar3,pVVar31->source);
  }
  if (pVVar25 == (pointer)0x0) {
    local_2d8 = (MemoryStream *)0x0;
  }
  else {
    local_2d8 = VertexData::VertexBuffer(pVVar3,pVVar25->source);
  }
  local_1b0 = VertexElement::TypeSize(pVVar26->type);
  if (pVVar29 == (pointer)0x0) {
    local_210 = 0;
  }
  else {
    local_210 = VertexElement::TypeSize(pVVar29->type);
  }
  if (pVVar31 == (pointer)0x0) {
    local_220 = 0;
  }
  else {
    local_220 = VertexElement::TypeSize(pVVar31->type);
  }
  if (pVVar25 == (pointer)0x0) {
    local_230 = 0;
  }
  else {
    local_230 = VertexElement::TypeSize(pVVar25->type);
  }
  uVar9 = VertexData::VertexSize(pVVar3,pVVar26->source);
  if (pVVar29 == (pointer)0x0) {
    local_208 = 0;
  }
  else {
    uVar10 = VertexData::VertexSize(pVVar3,pVVar29->source);
    local_208 = (ulong)uVar10;
  }
  if (pVVar31 == (pointer)0x0) {
    local_218 = 0;
  }
  else {
    uVar10 = VertexData::VertexSize(pVVar3,pVVar31->source);
    local_218 = (ulong)uVar10;
  }
  if (pVVar25 == (pointer)0x0) {
    local_228 = 0;
  }
  else {
    uVar10 = VertexData::VertexSize(pVVar3,pVVar25->source);
    local_228 = (ulong)uVar10;
  }
  local_1d8 = (pVVar3->super_IVertexData).boneAssignments.
              super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1e0 = (pVVar3->super_IVertexData).boneAssignments.
              super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_2c0 != (MemoryStream *)0x0) {
    paVar15 = (aiVector3D *)operator_new__(uVar27);
    if (uVar28 != 0) {
      memset(paVar15,0,((uVar27 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar11->mNormals = paVar15;
  }
  local_200 = pVVar3;
  if (local_2d0 == (MemoryStream *)0x0) {
    local_2d0 = (MemoryStream *)0x0;
  }
  else if (pVVar31->type - VET_FLOAT2 < 2) {
    sVar16 = VertexElement::ComponentCount(pVVar31->type);
    paVar11->mNumUVComponents[0] = (uint)sVar16;
    paVar15 = (aiVector3D *)operator_new__(uVar27);
    if (uVar28 != 0) {
      memset(paVar15,0,((uVar27 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar11->mTextureCoords[0] = paVar15;
  }
  else {
    pLVar17 = DefaultLogger::get();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Ogre imported UV0 type ",0x17);
    VertexElement::TypeToString_abi_cxx11_(&local_260,(VertexElement *)(ulong)pVVar31->type,type);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_260._M_dataplus._M_p,local_260._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," is not compatible with Assimp. Ignoring UV.",0x2c);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar17,(char *)local_290._M_impl._0_8_);
    if ((_Base_ptr *)local_290._M_impl._0_8_ !=
        &local_290._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_290._M_impl._0_8_,
                      (ulong)((long)&(local_290._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_2d0 = (MemoryStream *)0x0;
  }
  if (local_2d8 != (MemoryStream *)0x0) {
    if (pVVar25->type - VET_FLOAT2 < 2) {
      sVar16 = VertexElement::ComponentCount(pVVar25->type);
      paVar11->mNumUVComponents[1] = (uint)sVar16;
      paVar15 = (aiVector3D *)operator_new__(uVar27);
      if (uVar28 != 0) {
        memset(paVar15,0,((uVar27 - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar11->mTextureCoords[1] = paVar15;
      goto LAB_00461b07;
    }
    pLVar17 = DefaultLogger::get();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Ogre imported UV0 type ",0x17);
    VertexElement::TypeToString_abi_cxx11_(&local_260,(VertexElement *)(ulong)pVVar25->type,type_00)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_260._M_dataplus._M_p,local_260._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," is not compatible with Assimp. Ignoring UV.",0x2c);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar17,(char *)local_290._M_impl._0_8_);
    if ((_Base_ptr *)local_290._M_impl._0_8_ !=
        &local_290._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_290._M_impl._0_8_,
                      (ulong)((long)&(local_290._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  local_2d8 = (MemoryStream *)0x0;
LAB_00461b07:
  if (local_2d0 == (MemoryStream *)0x0) {
    local_2f0 = (aiVector3D *)0x0;
  }
  else {
    local_2f0 = paVar11->mTextureCoords[0];
  }
  if (local_2d8 == (MemoryStream *)0x0) {
    local_2c8 = (aiVector3D *)0x0;
  }
  else {
    local_2c8 = paVar11->mTextureCoords[1];
  }
  bVar35 = this->indexData->is32bit;
  local_1c8 = 6;
  if (bVar35 != false) {
    local_1c8 = 0xc;
  }
  if (uVar28 != 0) {
    local_1b8 = (ulong)uVar9;
    local_1d0 = (this->indexData->buffer).
                super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_240 = (ulong)bVar35 * 2 + 2;
    bVar35 = local_2f0 != (aiVector3D *)0x0;
    bVar36 = local_2c8 != (aiVector3D *)0x0;
    lVar34 = 0;
    iVar7 = 0;
    uVar28 = 0;
    do {
      peVar8 = local_1d0;
      pvVar18 = operator_new__(0xc);
      (*(peVar8->super_IOStream)._vptr_IOStream[4])(peVar8,uVar28 * local_1c8,0);
      lVar32 = local_240;
      if (this->indexData->is32bit == true) {
        (*(peVar8->super_IOStream)._vptr_IOStream[2])(peVar8,pvVar18,local_240,3);
      }
      else {
        local_1a8[0]._M_impl._0_8_ = local_1a8[0]._M_impl._0_8_ & 0xffffffffffff0000;
        lVar33 = 0;
        do {
          (*(peVar8->super_IOStream)._vptr_IOStream[2])(peVar8,local_1a8,lVar32,1);
          *(uint *)((long)pvVar18 + lVar33 * 4) = (uint)(ushort)local_1a8[0]._M_impl._0_2_;
          lVar33 = lVar33 + 1;
        } while (lVar33 != 3);
      }
      paVar5 = paVar11->mFaces;
      paVar5[uVar28].mNumIndices = 3;
      local_1c0 = uVar28;
      puVar19 = (uint *)operator_new__(0xc);
      paVar5[uVar28].mIndices = puVar19;
      lVar32 = 0;
      lVar33 = 0;
      do {
        uVar9 = iVar7 + (int)lVar33;
        paVar5[uVar28].mIndices[lVar33] = uVar9;
        uVar2 = *(uint *)((long)pvVar18 + lVar33 * 4);
        uVar27 = (ulong)uVar2;
        IVertexData::AddVertexMapping(&local_200->super_IVertexData,uVar2,uVar9);
        (*(local_1f0->super_IOStream)._vptr_IOStream[4])
                  (local_1f0,(ulong)pVVar26->offset + uVar27 * local_1b8,0);
        (*(local_1f0->super_IOStream)._vptr_IOStream[2])
                  (local_1f0,(long)&(*local_1f8)->x + lVar32 + lVar34,local_1b0,1);
        if (local_2c0 != (MemoryStream *)0x0) {
          (*(local_2c0->super_IOStream)._vptr_IOStream[4])
                    (local_2c0,(ulong)pVVar29->offset + local_208 * uVar27,0);
          (*(local_2c0->super_IOStream)._vptr_IOStream[2])
                    (local_2c0,(long)&paVar11->mNormals->x + lVar32 + lVar34,local_210,1);
        }
        if (bVar35 && local_2d0 != (MemoryStream *)0x0) {
          (*(local_2d0->super_IOStream)._vptr_IOStream[4])
                    (local_2d0,(ulong)pVVar31->offset + local_218 * uVar27,0);
          (*(local_2d0->super_IOStream)._vptr_IOStream[2])
                    (local_2d0,(long)&local_2f0->x + lVar32,local_220,1);
          *(float *)((long)&local_2f0->y + lVar32) = 1.0 - *(float *)((long)&local_2f0->y + lVar32);
        }
        if (bVar36 && local_2d8 != (MemoryStream *)0x0) {
          (*(local_2d8->super_IOStream)._vptr_IOStream[4])
                    (local_2d8,(ulong)pVVar25->offset + uVar27 * local_228,0);
          (*(local_2d8->super_IOStream)._vptr_IOStream[2])
                    (local_2d8,(long)&local_2c8->x + lVar32,local_230,1);
          *(float *)((long)&local_2c8->y + lVar32) = 1.0 - *(float *)((long)&local_2c8->y + lVar32);
        }
        lVar33 = lVar33 + 1;
        lVar32 = lVar32 + 0xc;
      } while (lVar32 != 0x24);
      operator_delete__(pvVar18);
      uVar28 = local_1c0 + 1;
      iVar7 = iVar7 + 3;
      lVar34 = lVar34 + 0x24;
      local_2f0 = local_2f0 + 3;
      local_2c8 = local_2c8 + 3;
      this = local_238;
    } while (uVar28 < paVar11->mNumFaces);
  }
  pVVar3 = local_200;
  if ((local_1d8 != local_1e0) && (parent->skeleton != (Skeleton *)0x0)) {
    IVertexData::AssimpBoneWeights
              ((AssimpVertexBoneWeightList *)local_1a8,&local_200->super_IVertexData,
               (ulong)paVar11->mNumVertices);
    IVertexData::ReferencedBonesByWeights
              ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
               &local_290,&pVVar3->super_IVertexData);
    paVar11->mNumBones = (uint)local_290._M_impl.super__Rb_tree_header._M_node_count;
    ppaVar20 = (aiBone **)
               operator_new__((local_290._M_impl.super__Rb_tree_header._M_node_count & 0xffffffff)
                              << 3);
    *local_1e8 = ppaVar20;
    p_Var1 = &local_290._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_290._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      lVar34 = 0;
      p_Var23 = local_290._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        ppBVar21 = (parent->skeleton->bones).
                   super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppBVar6 = (parent->skeleton->bones).
                  super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (ppBVar21 != ppBVar6) {
          do {
            this_00 = *ppBVar21;
            if (this_00->id == (short)p_Var23[1]._M_color) goto LAB_00461f5e;
            ppBVar21 = ppBVar21 + 1;
          } while (ppBVar21 != ppBVar6);
        }
        this_00 = (Bone *)0x0;
LAB_00461f5e:
        pBVar30 = this_00;
        boneWeights = std::
                      map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                      ::operator[]((map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                    *)local_1a8,&this_00->id);
        paVar22 = Bone::ConvertToAssimpBone(this_00,(Skeleton *)pBVar30,boneWeights);
        ppaVar20[lVar34] = paVar22;
        p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
        lVar34 = lVar34 + 1;
      } while ((_Rb_tree_header *)p_Var23 != p_Var1);
    }
    std::
    _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
    ::~_Rb_tree(&local_290);
    std::
    _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
    ::~_Rb_tree(local_1a8);
  }
  return paVar11;
}

Assistant:

aiMesh *SubMesh::ConvertToAssimpMesh(Mesh *parent)
{
    if (operationType != OT_TRIANGLE_LIST) {
        throw DeadlyImportError(Formatter::format() << "Only mesh operation type OT_TRIANGLE_LIST is supported. Found " << operationType);
    }

    aiMesh *dest = new aiMesh();
    dest->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    if (!name.empty())
        dest->mName = name;

    // Material index
    if (materialIndex != -1)
        dest->mMaterialIndex = materialIndex;

    // Pick source vertex data from shader geometry or from internal geometry.
    VertexData *src = (!usesSharedVertexData ? vertexData : parent->sharedVertexData);

    VertexElement *positionsElement = src->GetVertexElement(VertexElement::VES_POSITION);
    VertexElement *normalsElement   = src->GetVertexElement(VertexElement::VES_NORMAL);
    VertexElement *uv1Element       = src->GetVertexElement(VertexElement::VES_TEXTURE_COORDINATES, 0);
    VertexElement *uv2Element       = src->GetVertexElement(VertexElement::VES_TEXTURE_COORDINATES, 1);

    // Sanity checks
    if (!positionsElement) {
        throw DeadlyImportError("Failed to import Ogre VertexElement::VES_POSITION. Mesh does not have vertex positions!");
    } else if (positionsElement->type != VertexElement::VET_FLOAT3) {
        throw DeadlyImportError("Ogre Mesh position vertex element type != VertexElement::VET_FLOAT3. This is not supported.");
    } else if (normalsElement && normalsElement->type != VertexElement::VET_FLOAT3) {
        throw DeadlyImportError("Ogre Mesh normal vertex element type != VertexElement::VET_FLOAT3. This is not supported.");
    }

    // Faces
    dest->mNumFaces = indexData->faceCount;
    dest->mFaces = new aiFace[dest->mNumFaces];

    // Assimp required unique vertices, we need to convert from Ogres shared indexing.
    size_t uniqueVertexCount = dest->mNumFaces * 3;
    dest->mNumVertices = static_cast<unsigned int>(uniqueVertexCount);
    dest->mVertices = new aiVector3D[dest->mNumVertices];

    // Source streams
    MemoryStream *positions      = src->VertexBuffer(positionsElement->source);
    MemoryStream *normals        = (normalsElement ? src->VertexBuffer(normalsElement->source) : 0);
    MemoryStream *uv1            = (uv1Element ? src->VertexBuffer(uv1Element->source) : 0);
    MemoryStream *uv2            = (uv2Element ? src->VertexBuffer(uv2Element->source) : 0);

    // Element size
    const size_t sizePosition    = positionsElement->Size();
    const size_t sizeNormal      = (normalsElement ? normalsElement->Size() : 0);
    const size_t sizeUv1         = (uv1Element ? uv1Element->Size() : 0);
    const size_t sizeUv2         = (uv2Element ? uv2Element->Size() : 0);

    // Vertex width
    const size_t vWidthPosition  = src->VertexSize(positionsElement->source);
    const size_t vWidthNormal    = (normalsElement ? src->VertexSize(normalsElement->source) : 0);
    const size_t vWidthUv1       = (uv1Element ? src->VertexSize(uv1Element->source) : 0);
    const size_t vWidthUv2       = (uv2Element ? src->VertexSize(uv2Element->source) : 0);

    bool boneAssignments = src->HasBoneAssignments();

    // Prepare normals
    if (normals)
        dest->mNormals = new aiVector3D[dest->mNumVertices];

    // Prepare UVs, ignoring incompatible UVs.
    if (uv1)
    {
        if (uv1Element->type == VertexElement::VET_FLOAT2 || uv1Element->type == VertexElement::VET_FLOAT3)
        {
            dest->mNumUVComponents[0] = static_cast<unsigned int>(uv1Element->ComponentCount());
            dest->mTextureCoords[0] = new aiVector3D[dest->mNumVertices];
        }
        else
        {
            ASSIMP_LOG_WARN(Formatter::format() << "Ogre imported UV0 type " << uv1Element->TypeToString() << " is not compatible with Assimp. Ignoring UV.");
            uv1 = 0;
        }
    }
    if (uv2)
    {
        if (uv2Element->type == VertexElement::VET_FLOAT2 || uv2Element->type == VertexElement::VET_FLOAT3)
        {
            dest->mNumUVComponents[1] = static_cast<unsigned int>(uv2Element->ComponentCount());
            dest->mTextureCoords[1] = new aiVector3D[dest->mNumVertices];
        }
        else
        {
            ASSIMP_LOG_WARN(Formatter::format() << "Ogre imported UV0 type " << uv2Element->TypeToString() << " is not compatible with Assimp. Ignoring UV.");
            uv2 = 0;
        }
    }

    aiVector3D *uv1Dest = (uv1 ? dest->mTextureCoords[0] : 0);
    aiVector3D *uv2Dest = (uv2 ? dest->mTextureCoords[1] : 0);

    MemoryStream *faces = indexData->buffer.get();
    for (size_t fi=0, isize=indexData->IndexSize(), fsize=indexData->FaceSize();
         fi<dest->mNumFaces; ++fi)
    {
        // Source Ogre face
        aiFace ogreFace;
        ogreFace.mNumIndices = 3;
        ogreFace.mIndices = new unsigned int[3];

        faces->Seek(fi * fsize, aiOrigin_SET);
        if (indexData->is32bit)
        {
            faces->Read(&ogreFace.mIndices[0], isize, 3);
        }
        else
        {
            uint16_t iout = 0;
            for (size_t ii=0; ii<3; ++ii)
            {
                faces->Read(&iout, isize, 1);
                ogreFace.mIndices[ii] = static_cast<unsigned int>(iout);
            }
        }

        // Destination Assimp face
        aiFace &face = dest->mFaces[fi];
        face.mNumIndices = 3;
        face.mIndices = new unsigned int[3];

        const size_t pos = fi * 3;
        for (size_t v=0; v<3; ++v)
        {
            const size_t newIndex = pos + v;

            // Write face index
            face.mIndices[v] = static_cast<unsigned int>(newIndex);

            // Ogres vertex index to ref into the source buffers.
            const size_t ogreVertexIndex = ogreFace.mIndices[v];
            src->AddVertexMapping(static_cast<uint32_t>(ogreVertexIndex), static_cast<uint32_t>(newIndex));

            // Position
            positions->Seek((vWidthPosition * ogreVertexIndex) + positionsElement->offset, aiOrigin_SET);
            positions->Read(&dest->mVertices[newIndex], sizePosition, 1);

            // Normal
            if (normals)
            {
                normals->Seek((vWidthNormal * ogreVertexIndex) + normalsElement->offset, aiOrigin_SET);
                normals->Read(&dest->mNormals[newIndex], sizeNormal, 1);
            }
            // UV0
            if (uv1 && uv1Dest)
            {
                uv1->Seek((vWidthUv1 * ogreVertexIndex) + uv1Element->offset, aiOrigin_SET);
                uv1->Read(&uv1Dest[newIndex], sizeUv1, 1);
                uv1Dest[newIndex].y = (uv1Dest[newIndex].y * -1) + 1; // Flip UV from Ogre to Assimp form
            }
            // UV1
            if (uv2 && uv2Dest)
            {
                uv2->Seek((vWidthUv2 * ogreVertexIndex) + uv2Element->offset, aiOrigin_SET);
                uv2->Read(&uv2Dest[newIndex], sizeUv2, 1);
                uv2Dest[newIndex].y = (uv2Dest[newIndex].y * -1) + 1; // Flip UV from Ogre to Assimp form
            }
        }
    }

    // Bones and bone weights
    if (parent->skeleton && boneAssignments)
    {
        AssimpVertexBoneWeightList weights = src->AssimpBoneWeights(dest->mNumVertices);
        std::set<uint16_t> referencedBones = src->ReferencedBonesByWeights();

        dest->mNumBones = static_cast<unsigned int>(referencedBones.size());
        dest->mBones = new aiBone*[dest->mNumBones];

        size_t assimpBoneIndex = 0;
        for(std::set<uint16_t>::const_iterator rbIter=referencedBones.begin(), rbEnd=referencedBones.end(); rbIter != rbEnd; ++rbIter, ++assimpBoneIndex)
        {
            Bone *bone = parent->skeleton->BoneById((*rbIter));
            dest->mBones[assimpBoneIndex] = bone->ConvertToAssimpBone(parent->skeleton, weights[bone->id]);
        }
    }

    return dest;
}